

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

void __thiscall QTextDocumentPrivate::endEditBlock(QTextDocumentPrivate *this)

{
  int *piVar1;
  byte bVar2;
  pointer pQVar3;
  uint uVar4;
  
  piVar1 = &this->editBlock;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  if ((this->undoEnabled == true) && (0 < this->undoState)) {
    uVar4 = this->undoState - 1;
    bVar2 = (this->undoStack).d.ptr[uVar4].field_0x2;
    if ((bVar2 & 1) != 0) {
      pQVar3 = QList<QTextUndoCommand>::data(&this->undoStack);
      pQVar3[uVar4].field_0x2 = pQVar3[uVar4].field_0x2 | 2;
      if ((bVar2 & 2) == 0) {
        QTextDocument::undoCommandAdded(*(QTextDocument **)&this->field_0x8);
      }
    }
  }
  this->editBlockCursorPosition = -1;
  finishEdit(this);
  return;
}

Assistant:

void QTextDocumentPrivate::endEditBlock()
{
    Q_ASSERT(editBlock > 0);
    if (--editBlock)
        return;

    if (undoEnabled && undoState > 0) {
        const bool wasBlocking = !undoStack.at(undoState - 1).block_end;
        if (undoStack.at(undoState - 1).block_part) {
            undoStack[undoState - 1].block_end = true;
            if (wasBlocking)
                emit document()->undoCommandAdded();
        }
    }

    editBlockCursorPosition = -1;

    finishEdit();
}